

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O0

void anon_unknown.dwarf_39a3::TestMakeCopy(bool use_local_arena)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  TemplateString TVar12;
  TemplateString TVar13;
  TemplateString TVar14;
  TemplateString TVar15;
  TemplateString TVar16;
  TemplateString TVar17;
  TemplateString TVar18;
  TemplateString TVar19;
  TemplateString TVar20;
  TemplateString TVar21;
  TemplateString TVar22;
  int iVar23;
  TemplateString *pTVar24;
  long lVar25;
  char *__s1;
  char *__s2;
  string local_550 [8];
  string copy;
  undefined1 local_530 [32];
  undefined1 local_510 [32];
  undefined1 local_4f0 [40];
  TemplateDictionary *dict_copy;
  string orig;
  TemplateString local_4a8;
  TemplateString local_488;
  long local_468;
  TemplateDictionary *subdict_3_1;
  size_t sStack_458;
  bool local_450;
  undefined7 uStack_44f;
  TemplateId TStack_448;
  TemplateString local_440;
  TemplateString local_420;
  undefined8 local_400;
  TemplateDictionary *subdict_3;
  size_t sStack_3f0;
  bool local_3e8;
  undefined7 uStack_3e7;
  TemplateId TStack_3e0;
  TemplateString local_3d8;
  TemplateString local_3b8;
  TemplateString local_398;
  TemplateString local_378;
  undefined8 local_358;
  TemplateDictionary *subdict_2b;
  size_t sStack_348;
  bool local_340;
  undefined7 uStack_33f;
  TemplateId TStack_338;
  TemplateString *local_330;
  TemplateDictionary *subdict_2a;
  size_t sStack_320;
  bool local_318;
  undefined7 uStack_317;
  TemplateId TStack_310;
  TemplateString local_308;
  TemplateString local_2e8;
  undefined8 local_2c8;
  TemplateDictionary *subdict_1b;
  size_t sStack_2b8;
  bool local_2b0;
  undefined7 uStack_2af;
  TemplateId TStack_2a8;
  TemplateString local_2a0;
  TemplateString local_280;
  TemplateString local_260;
  TemplateString *local_240;
  TemplateDictionary *subdict_1a;
  size_t sStack_230;
  bool local_228;
  undefined7 uStack_227;
  TemplateId TStack_220;
  TemplateString local_218;
  TemplateString local_1f8;
  TemplateString local_1d8;
  TemplateString local_1b8;
  TemplateString *local_188;
  TemplateDictionary *dict;
  UnsafeArena *arena;
  UnsafeArena local_arena;
  bool use_local_arena_local;
  
  local_arena._359_1_ = use_local_arena;
  ctemplate::UnsafeArena::UnsafeArena((UnsafeArena *)&arena,0x400);
  dict = (TemplateDictionary *)0x0;
  if ((local_arena._359_1_ & 1) != 0) {
    dict = (TemplateDictionary *)&arena;
  }
  pTVar24 = (TemplateString *)operator_new(0x70);
  ctemplate::TemplateString::TemplateString(&local_1b8,"testdict");
  ctemplate::TemplateDictionary::TemplateDictionary
            ((TemplateDictionary *)pTVar24,&local_1b8,(UnsafeArena *)dict);
  local_188 = pTVar24;
  ctemplate::TemplateString::TemplateString(&local_1d8,"TOPLEVEL");
  ctemplate::TemplateString::TemplateString(&local_1f8,"foo");
  TVar1.length_ = local_1d8.length_;
  TVar1.ptr_ = local_1d8.ptr_;
  TVar1.is_immutable_ = local_1d8.is_immutable_;
  TVar1._17_7_ = local_1d8._17_7_;
  TVar1.id_ = local_1d8.id_;
  TVar16.length_ = local_1f8.length_;
  TVar16.ptr_ = local_1f8.ptr_;
  TVar16.is_immutable_ = local_1f8.is_immutable_;
  TVar16._17_7_ = local_1f8._17_7_;
  TVar16.id_ = local_1f8.id_;
  ctemplate::TemplateDictionary::SetValue(TVar1,TVar16);
  ctemplate::TemplateString::TemplateString(&local_218,"TEMPLATELEVEL");
  ctemplate::TemplateString::TemplateString((TemplateString *)&subdict_1a,"foo3");
  TVar2.length_ = local_218.length_;
  TVar2.ptr_ = local_218.ptr_;
  TVar2.is_immutable_ = local_218.is_immutable_;
  TVar2._17_7_ = local_218._17_7_;
  TVar2.id_ = local_218.id_;
  TVar17.length_ = sStack_230;
  TVar17.ptr_ = (char *)subdict_1a;
  TVar17.is_immutable_ = local_228;
  TVar17._17_7_ = uStack_227;
  TVar17.id_ = TStack_220;
  ctemplate::TemplateDictionary::SetTemplateGlobalValue(TVar2,TVar17);
  ctemplate::TemplateString::TemplateString(&local_260,"include1");
  TVar3.length_ = local_260.length_;
  TVar3.ptr_ = local_260.ptr_;
  TVar3.is_immutable_ = local_260.is_immutable_;
  TVar3._17_7_ = local_260._17_7_;
  TVar3.id_ = local_260.id_;
  local_240 = (TemplateString *)ctemplate::TemplateDictionary::AddIncludeDictionary(TVar3);
  ctemplate::TemplateString::TemplateString(&local_280,"incfile1a");
  TVar4.length_ = local_280.length_;
  TVar4.ptr_ = local_280.ptr_;
  TVar4.is_immutable_ = local_280.is_immutable_;
  TVar4._17_7_ = local_280._17_7_;
  TVar4.id_ = local_280.id_;
  ctemplate::TemplateDictionary::SetFilename(TVar4);
  ctemplate::TemplateString::TemplateString(&local_2a0,"SUBLEVEL");
  ctemplate::TemplateString::TemplateString((TemplateString *)&subdict_1b,"subfoo");
  TVar5.length_ = local_2a0.length_;
  TVar5.ptr_ = local_2a0.ptr_;
  TVar5.is_immutable_ = local_2a0.is_immutable_;
  TVar5._17_7_ = local_2a0._17_7_;
  TVar5.id_ = local_2a0.id_;
  TVar18.length_ = sStack_2b8;
  TVar18.ptr_ = (char *)subdict_1b;
  TVar18.is_immutable_ = local_2b0;
  TVar18._17_7_ = uStack_2af;
  TVar18.id_ = TStack_2a8;
  ctemplate::TemplateDictionary::SetValue(TVar5,TVar18);
  ctemplate::TemplateString::TemplateString(&local_2e8,"include1");
  TVar6.length_ = local_2e8.length_;
  TVar6.ptr_ = local_2e8.ptr_;
  TVar6.is_immutable_ = local_2e8.is_immutable_;
  TVar6._17_7_ = local_2e8._17_7_;
  TVar6.id_ = local_2e8.id_;
  local_2c8 = ctemplate::TemplateDictionary::AddIncludeDictionary(TVar6);
  ctemplate::TemplateString::TemplateString(&local_308,"SUBLEVEL");
  ctemplate::TemplateString::TemplateString((TemplateString *)&subdict_2a,"subbar");
  TVar7.length_ = local_308.length_;
  TVar7.ptr_ = local_308.ptr_;
  TVar7.is_immutable_ = local_308.is_immutable_;
  TVar7._17_7_ = local_308._17_7_;
  TVar7.id_ = local_308.id_;
  TVar19.length_ = sStack_320;
  TVar19.ptr_ = (char *)subdict_2a;
  TVar19.is_immutable_ = local_318;
  TVar19._17_7_ = uStack_317;
  TVar19.id_ = TStack_310;
  ctemplate::TemplateDictionary::SetValue(TVar7,TVar19);
  ctemplate::TemplateString::TemplateString((TemplateString *)&subdict_2b,"section1");
  TVar8.length_ = sStack_348;
  TVar8.ptr_ = (char *)subdict_2b;
  TVar8.is_immutable_ = local_340;
  TVar8._17_7_ = uStack_33f;
  TVar8.id_ = TStack_338;
  local_330 = (TemplateString *)ctemplate::TemplateDictionary::AddSectionDictionary(TVar8);
  ctemplate::TemplateString::TemplateString(&local_378,"section1");
  TVar9.length_ = local_378.length_;
  TVar9.ptr_ = local_378.ptr_;
  TVar9.is_immutable_ = local_378.is_immutable_;
  TVar9._17_7_ = local_378._17_7_;
  TVar9.id_ = local_378.id_;
  local_358 = ctemplate::TemplateDictionary::AddSectionDictionary(TVar9);
  ctemplate::TemplateString::TemplateString(&local_398,"SUBLEVEL");
  ctemplate::TemplateString::TemplateString(&local_3b8,"subfoo");
  TVar10.length_ = local_398.length_;
  TVar10.ptr_ = local_398.ptr_;
  TVar10.is_immutable_ = local_398.is_immutable_;
  TVar10._17_7_ = local_398._17_7_;
  TVar10.id_ = local_398.id_;
  TVar20.length_ = local_3b8.length_;
  TVar20.ptr_ = local_3b8.ptr_;
  TVar20.is_immutable_ = local_3b8.is_immutable_;
  TVar20._17_7_ = local_3b8._17_7_;
  TVar20.id_ = local_3b8.id_;
  ctemplate::TemplateDictionary::SetValue(TVar10,TVar20);
  ctemplate::TemplateString::TemplateString(&local_3d8,"SUBLEVEL");
  ctemplate::TemplateString::TemplateString((TemplateString *)&subdict_3,"subbar");
  TVar11.length_ = local_3d8.length_;
  TVar11.ptr_ = local_3d8.ptr_;
  TVar11.is_immutable_ = local_3d8.is_immutable_;
  TVar11._17_7_ = local_3d8._17_7_;
  TVar11.id_ = local_3d8.id_;
  TVar21.length_ = sStack_3f0;
  TVar21.ptr_ = (char *)subdict_3;
  TVar21.is_immutable_ = local_3e8;
  TVar21._17_7_ = uStack_3e7;
  TVar21.id_ = TStack_3e0;
  ctemplate::TemplateDictionary::SetValue(TVar11,TVar21);
  ctemplate::TemplateString::TemplateString(&local_420,"section2");
  TVar12.length_ = local_420.length_;
  TVar12.ptr_ = local_420.ptr_;
  TVar12.is_immutable_ = local_420.is_immutable_;
  TVar12._17_7_ = local_420._17_7_;
  TVar12.id_ = local_420.id_;
  local_400 = ctemplate::TemplateDictionary::AddSectionDictionary(TVar12);
  ctemplate::TemplateString::TemplateString(&local_440,"TOPLEVEL");
  ctemplate::TemplateString::TemplateString((TemplateString *)&subdict_3_1,"bar");
  TVar13.length_ = local_440.length_;
  TVar13.ptr_ = local_440.ptr_;
  TVar13.is_immutable_ = local_440.is_immutable_;
  TVar13._17_7_ = local_440._17_7_;
  TVar13.id_ = local_440.id_;
  TVar22.length_ = sStack_458;
  TVar22.ptr_ = (char *)subdict_3_1;
  TVar22.is_immutable_ = local_450;
  TVar22._17_7_ = uStack_44f;
  TVar22.id_ = TStack_448;
  ctemplate::TemplateDictionary::SetValue(TVar13,TVar22);
  ctemplate::TemplateString::TemplateString(&local_488,"sub");
  TVar14.length_ = local_488.length_;
  TVar14.ptr_ = local_488.ptr_;
  TVar14.is_immutable_ = local_488.is_immutable_;
  TVar14._17_7_ = local_488._17_7_;
  TVar14.id_ = local_488.id_;
  lVar25 = ctemplate::TemplateDictionary::AddSectionDictionary(TVar14);
  local_468 = lVar25;
  ctemplate::TemplateString::TemplateString(&local_4a8,"GLOBAL");
  TVar15.length_ = local_4a8.length_;
  TVar15.ptr_ = local_4a8.ptr_;
  TVar15.is_immutable_ = local_4a8.is_immutable_;
  TVar15._17_7_ = local_4a8._17_7_;
  TVar15.id_ = local_4a8.id_;
  ctemplate::TemplateDictionary::SetIntValue(TVar15,lVar25);
  std::__cxx11::string::string((string *)&dict_copy);
  (**(code **)(local_188->ptr_ + 0x20))(local_188,(string *)&dict_copy,0);
  pTVar24 = local_188;
  ctemplate::TemplateString::TemplateString((TemplateString *)local_4f0,"testdict");
  local_4f0._32_8_ = ctemplate::TemplateDictionary::MakeCopy(pTVar24,(UnsafeArena *)local_4f0);
  pTVar24 = local_240;
  ctemplate::TemplateString::TemplateString((TemplateString *)local_510,"copy of subdict");
  lVar25 = ctemplate::TemplateDictionary::MakeCopy(pTVar24,(UnsafeArena *)local_510);
  pTVar24 = local_330;
  if (lVar25 != 0) {
    fprintf(_stderr,"Check failed: %s\n","subdict_1a->MakeCopy(\"copy of subdict\") == __null");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString((TemplateString *)local_530,"copy of subdict");
  lVar25 = ctemplate::TemplateDictionary::MakeCopy(pTVar24,(UnsafeArena *)local_530);
  if (lVar25 != 0) {
    fprintf(_stderr,"Check failed: %s\n","subdict_2a->MakeCopy(\"copy of subdict\") == __null");
    exit(1);
  }
  if (local_188 != (TemplateString *)0x0) {
    (**(code **)(local_188->ptr_ + 8))();
  }
  local_188 = (TemplateString *)0x0;
  std::__cxx11::string::string(local_550);
  (**(code **)(*(long *)local_4f0._32_8_ + 0x20))(local_4f0._32_8_,local_550,0);
  if ((long *)local_4f0._32_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_4f0._32_8_ + 8))();
  }
  __s1 = (char *)std::__cxx11::string::c_str();
  __s2 = (char *)std::__cxx11::string::c_str();
  iVar23 = strcmp(__s1,__s2);
  if (iVar23 != 0) {
    fprintf(_stderr,"Check failed: %s\n","strcmp(orig.c_str(), copy.c_str()) == 0");
    exit(1);
  }
  std::__cxx11::string::~string(local_550);
  std::__cxx11::string::~string((string *)&dict_copy);
  ctemplate::UnsafeArena::~UnsafeArena((UnsafeArena *)&arena);
  return;
}

Assistant:

static void TestMakeCopy(bool use_local_arena) {
  UnsafeArena local_arena(1024);
  UnsafeArena* arena = NULL;
  if (use_local_arena)
    arena = &local_arena;

  // First, let's make a non-trivial template dictionary (We use
  // 'new' because later we'll test deleting this dict but keeping
  // around the copy.)
  TemplateDictionary* dict = new TemplateDictionary("testdict", arena);

  dict->SetValue("TOPLEVEL", "foo");

  dict->SetTemplateGlobalValue("TEMPLATELEVEL", "foo3");

  TemplateDictionary* subdict_1a = dict->AddIncludeDictionary("include1");
  subdict_1a->SetFilename("incfile1a");
  subdict_1a->SetValue("SUBLEVEL", "subfoo");
  TemplateDictionary* subdict_1b = dict->AddIncludeDictionary("include1");
  // Let's try not calling SetFilename on this one.
  subdict_1b->SetValue("SUBLEVEL", "subbar");

  TemplateDictionary* subdict_2a = dict->AddSectionDictionary("section1");
  TemplateDictionary* subdict_2b = dict->AddSectionDictionary("section1");
  subdict_2a->SetValue("SUBLEVEL", "subfoo");
  subdict_2b->SetValue("SUBLEVEL", "subbar");
  TemplateDictionary* subdict_3 = dict->AddSectionDictionary("section2");
  subdict_3->SetValue("TOPLEVEL", "bar");    // overriding top dict
  TemplateDictionary* subdict_3_1 = subdict_3->AddSectionDictionary("sub");
  subdict_3_1->SetIntValue("GLOBAL", 21);    // overrides value in setUp()

  string orig;
  dict->DumpToString(&orig);

  // Make a copy
  TemplateDictionary* dict_copy = dict->MakeCopy("testdict", NULL);
  // Make sure it doesn't work to copy a sub-dictionary
  EXPECT_TRUE(subdict_1a->MakeCopy("copy of subdict") == NULL);
  EXPECT_TRUE(subdict_2a->MakeCopy("copy of subdict") == NULL);

  // Delete the original dict, to make sure the copy really is independent
  delete dict;
  dict = NULL;
  string copy;
  dict_copy->DumpToString(&copy);
  delete dict_copy;

  EXPECT_STREQ(orig.c_str(), copy.c_str());
}